

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

bool gpt_params_parse(int argc,char **argv,gpt_params *params)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  FILE *pFVar4;
  int iVar5;
  float fVar6;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  allocator<char> local_275;
  int local_274;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  string arg;
  ifstream file;
  undefined8 auStack_150 [36];
  
  local_268 = &params->antiprompt;
  local_260 = &params->model;
  local_270.container = &params->prompt;
  iVar5 = 1;
  local_274 = argc;
  do {
    if (local_274 <= iVar5) {
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,argv[iVar5],(allocator<char> *)&file);
    bVar1 = std::operator==(&arg,"-s");
    if (bVar1) {
LAB_00113767:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&file,argv[(long)iVar5 + 1],&local_275);
      iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
      params->seed = iVar2;
LAB_0011378b:
      iVar5 = iVar5 + 1;
      std::__cxx11::string::~string((string *)&file);
    }
    else {
      bVar1 = std::operator==(&arg,"--seed");
      if (bVar1) goto LAB_00113767;
      bVar1 = std::operator==(&arg,"-t");
      if (bVar1) {
LAB_001137c6:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&file,argv[(long)iVar5 + 1],&local_275);
        iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
        params->n_threads = iVar2;
        goto LAB_0011378b;
      }
      bVar1 = std::operator==(&arg,"--threads");
      if (bVar1) goto LAB_001137c6;
      bVar1 = std::operator==(&arg,"-p");
      if (!bVar1) {
        bVar1 = std::operator==(&arg,"--prompt");
        if (bVar1) goto LAB_00113813;
        bVar1 = std::operator==(&arg,"-f");
        if (bVar1) {
LAB_00113859:
          params->interactive_start = false;
          params->use_color = false;
          params->interactive = false;
          std::ifstream::ifstream((string *)&file,argv[(long)iVar5 + 1],_S_in);
          __first._8_8_ = 0xffffffff;
          __first._M_sbuf = *(streambuf_type **)((long)auStack_150 + *(long *)(_file + -0x18));
          std::__copy_move<false,false,std::input_iterator_tag>::
          __copy_m<std::istreambuf_iterator<char,std::char_traits<char>>,std::back_insert_iterator<std::__cxx11::string>>
                    (__first,(istreambuf_iterator<char,_std::char_traits<char>_>)
                             (ZEXT816(0xffffffffffffffff) << 0x40),local_270);
          iVar5 = iVar5 + 1;
          std::ifstream::~ifstream((string *)&file);
          goto LAB_00113793;
        }
        bVar1 = std::operator==(&arg,"--file");
        if (bVar1) goto LAB_00113859;
        bVar1 = std::operator==(&arg,"-n");
        if (!bVar1) {
          bVar1 = std::operator==(&arg,"--n_predict");
          if (bVar1) goto LAB_001138ca;
          bVar1 = std::operator==(&arg,"--top_k");
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&file,argv[(long)iVar5 + 1],&local_275);
            iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
            params->top_k = iVar2;
            goto LAB_0011378b;
          }
          bVar1 = std::operator==(&arg,"-c");
          if (bVar1) {
LAB_00113957:
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&file,argv[(long)iVar5 + 1],&local_275);
            iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
            params->n_ctx = iVar2;
            goto LAB_0011378b;
          }
          bVar1 = std::operator==(&arg,"--ctx_size");
          if (bVar1) goto LAB_00113957;
          bVar1 = std::operator==(&arg,"--top_p");
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&file,argv[(long)iVar5 + 1],&local_275);
            fVar6 = std::__cxx11::stof((string *)&file,(size_t *)0x0);
            params->top_p = fVar6;
            goto LAB_0011378b;
          }
          bVar1 = std::operator==(&arg,"--temp");
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&file,argv[(long)iVar5 + 1],&local_275);
            fVar6 = std::__cxx11::stof((string *)&file,(size_t *)0x0);
            params->temp = fVar6;
            goto LAB_0011378b;
          }
          bVar1 = std::operator==(&arg,"--repeat_last_n");
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&file,argv[(long)iVar5 + 1],&local_275);
            iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
            params->repeat_last_n = iVar2;
            goto LAB_0011378b;
          }
          bVar1 = std::operator==(&arg,"--repeat_penalty");
          if (bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&file,argv[(long)iVar5 + 1],&local_275);
            fVar6 = std::__cxx11::stof((string *)&file,(size_t *)0x0);
            params->repeat_penalty = fVar6;
            goto LAB_0011378b;
          }
          bVar1 = std::operator==(&arg,"-b");
          if (bVar1) {
LAB_00113a98:
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&file,argv[(long)iVar5 + 1],&local_275);
            iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
            params->n_batch = iVar2;
            goto LAB_0011378b;
          }
          bVar1 = std::operator==(&arg,"--batch_size");
          if (bVar1) goto LAB_00113a98;
          bVar1 = std::operator==(&arg,"-m");
          if (!bVar1) {
            bVar1 = std::operator==(&arg,"--model");
            if (bVar1) goto LAB_00113ae8;
            bVar1 = std::operator==(&arg,"-i");
            if (!bVar1) {
              bVar1 = std::operator==(&arg,"--interactive");
              if (bVar1) goto LAB_00113b22;
              bVar1 = std::operator==(&arg,"--interactive-start");
              if (bVar1) {
                params->interactive = true;
                params->interactive_start = true;
                goto LAB_00113793;
              }
              bVar1 = std::operator==(&arg,"--color");
              if (bVar1) {
                params->use_color = true;
                goto LAB_00113793;
              }
              bVar1 = std::operator==(&arg,"-r");
              if (!bVar1) {
                bVar1 = std::operator==(&arg,"--reverse-prompt");
                if (!bVar1) {
                  pbVar3 = &arg;
                  bVar1 = std::operator==(pbVar3,"-h");
                  iVar5 = (int)pbVar3;
                  if (!bVar1) {
                    pbVar3 = &arg;
                    bVar1 = std::operator==(pbVar3,"--help");
                    iVar5 = (int)pbVar3;
                    if (!bVar1) {
                      pFVar4 = _stderr;
                      fprintf(_stderr,"error: unknown argument: %s\n",arg._M_dataplus._M_p);
                      iVar5 = (int)pFVar4;
                    }
                  }
                  gpt_print_usage(iVar5,argv,params);
                  exit(0);
                }
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              assign(local_268,argv[(long)iVar5 + 1]);
              goto LAB_0011382b;
            }
LAB_00113b22:
            params->interactive = true;
            goto LAB_00113793;
          }
LAB_00113ae8:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (local_260,argv[(long)iVar5 + 1]);
          goto LAB_0011382b;
        }
LAB_001138ca:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&file,argv[(long)iVar5 + 1],&local_275);
        iVar2 = std::__cxx11::stoi((string *)&file,(size_t *)0x0,10);
        params->n_predict = iVar2;
        goto LAB_0011378b;
      }
LAB_00113813:
      params->interactive_start = false;
      params->use_color = false;
      params->interactive = false;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (local_270.container,argv[(long)iVar5 + 1]);
LAB_0011382b:
      iVar5 = iVar5 + 1;
    }
LAB_00113793:
    std::__cxx11::string::~string((string *)&arg);
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

bool gpt_params_parse(int argc, char ** argv, gpt_params & params) {
    for (int i = 1; i < argc; i++) {
        std::string arg = argv[i];

        if (arg == "-s" || arg == "--seed") {
            params.seed = std::stoi(argv[++i]);
        } else if (arg == "-t" || arg == "--threads") {
            params.n_threads = std::stoi(argv[++i]);
        } else if (arg == "-p" || arg == "--prompt") {
            params.interactive = false;
            params.interactive_start = false;
            params.use_color = false;

            params.prompt = argv[++i];
        } else if (arg == "-f" || arg == "--file") {

            params.interactive = false;
            params.interactive_start = false;
            params.use_color = false;

            std::ifstream file(argv[++i]);

            std::copy(std::istreambuf_iterator<char>(file),
                    std::istreambuf_iterator<char>(),
                    back_inserter(params.prompt));
                
        } else if (arg == "-n" || arg == "--n_predict") {
            params.n_predict = std::stoi(argv[++i]);
        } else if (arg == "--top_k") {
            params.top_k = std::stoi(argv[++i]);
        } else if (arg == "-c" || arg == "--ctx_size") {
            params.n_ctx = std::stoi(argv[++i]);
        } else if (arg == "--top_p") {
            params.top_p = std::stof(argv[++i]);
        } else if (arg == "--temp") {
            params.temp = std::stof(argv[++i]);
        } else if (arg == "--repeat_last_n") {
            params.repeat_last_n = std::stoi(argv[++i]);
        } else if (arg == "--repeat_penalty") {
            params.repeat_penalty = std::stof(argv[++i]);
        } else if (arg == "-b" || arg == "--batch_size") {
            params.n_batch = std::stoi(argv[++i]);
        } else if (arg == "-m" || arg == "--model") {
            params.model = argv[++i];
        } else if (arg == "-i" || arg == "--interactive") {
            params.interactive = true;
        } else if (arg == "--interactive-start") {
            params.interactive = true;
            params.interactive_start = true;
        } else if (arg == "--color") {
            params.use_color = true;
        } else if (arg == "-r" || arg == "--reverse-prompt") {
            params.antiprompt = argv[++i];
        } else if (arg == "-h" || arg == "--help") {
            gpt_print_usage(argc, argv, params);
            exit(0);
        } else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            gpt_print_usage(argc, argv, params);
            exit(0);
        }
    }

    return true;
}